

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O2

bool Shell::FunctionDefinition::occurs(uint f,Term *t)

{
  bool bVar1;
  uint uVar2;
  TermFunIterator funs;
  TermFunIterator local_50;
  
  Kernel::TermFunIterator::TermFunIterator(&local_50,t);
  do {
    bVar1 = Kernel::TermFunIterator::hasNext(&local_50);
    if (!bVar1) break;
    uVar2 = Kernel::TermFunIterator::next(&local_50);
  } while (uVar2 != f);
  Kernel::TermFunIterator::~TermFunIterator(&local_50);
  return bVar1;
}

Assistant:

bool FunctionDefinition::occurs (unsigned f, Term& t)
{
  TermFunIterator funs(&t);
  while (funs.hasNext()) {
    if (f == funs.next()) {
      return true;
    }
  }
  return false;
}